

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QItemSelectionRange *range)

{
  QPersistentModelIndex *idx;
  QDebug *pQVar1;
  QPersistentModelIndex *other;
  QItemSelectionRange *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  char in_stack_ffffffffffffff5f;
  QDebugStateSaver *in_stack_ffffffffffffff60;
  QDebug *in_stack_ffffffffffffff78;
  QDebugStateSaver *in_stack_ffffffffffffff80;
  Stream *this;
  QDebug *in_stack_ffffffffffffffa8;
  QDebug local_30 [2];
  QDebug local_20 [2];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  idx = (QPersistentModelIndex *)QDebug::nospace(in_RSI);
  pQVar1 = QDebug::operator<<((QDebug *)this,(char *)in_RDX);
  QDebug::QDebug(local_30,pQVar1);
  QItemSelectionRange::topLeft(in_RDX);
  operator<<(in_stack_ffffffffffffffa8,idx);
  pQVar1 = QDebug::operator<<((QDebug *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  QDebug::QDebug(local_20,pQVar1);
  other = QItemSelectionRange::bottomRight(in_RDX);
  operator<<(in_stack_ffffffffffffffa8,idx);
  QDebug::operator<<((QDebug *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  QDebug::~QDebug(in_stack_ffffffffffffffa8);
  QDebug::~QDebug(in_stack_ffffffffffffffa8);
  QDebug::~QDebug(in_stack_ffffffffffffffa8);
  QDebug::~QDebug(in_stack_ffffffffffffffa8);
  QDebug::QDebug(pQVar1,(QDebug *)other);
  QDebugStateSaver::~QDebugStateSaver(in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QItemSelectionRange &range)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QItemSelectionRange(" << range.topLeft()
                  << ',' << range.bottomRight() << ')';
    return dbg;
}